

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>
::
ForEachActive<mp::Convert1<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>,mp::Convert1QC>>
          (ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>
           *this,Convert1<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>,_mp::Convert1QC>
                 fn)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ConType *con;
  long lVar6;
  int i;
  long lVar7;
  Convert1<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>,_mp::Convert1QC>
  local_30;
  
  lVar6 = 0;
  lVar7 = 0;
  local_30.
  super_Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  .
  super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  .mc_ = fn.
         super_Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
         .
         super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
         .mc_;
  while( true ) {
    lVar4 = *(long *)(this + 0xf8);
    lVar1 = *(long *)(this + 0xe0);
    if ((int)((int)((ulong)(*(long *)(this + 0xf0) - lVar1) >> 3) * -0x41041041 +
             (int)((ulong)(*(long *)(this + 0x100) - *(long *)(this + 0x108)) >> 3) * -0x41041041 +
             (int)((ulong)(*(long *)(this + 0x118) - lVar4) >> 3) + -1 +
             (uint)(*(long *)(this + 0x118) == 0)) <= lVar7) break;
    lVar3 = (lVar1 - *(long *)(this + 0xe8) >> 3) * -0x1041041041041041 + lVar7;
    if (lVar3 == 0) {
      lVar5 = lVar1 + lVar6;
    }
    else {
      lVar5 = *(long *)(lVar4 + lVar3 * 8);
    }
    if ((*(char *)(lVar5 + 0x1f0) == '\0') && (*(char *)(lVar5 + 0x1f1) == '\0')) {
      if (lVar3 == 0) {
        con = (ConType *)(lVar1 + lVar6);
      }
      else {
        con = *(ConType **)(lVar4 + lVar3 * 8);
      }
      bVar2 = Convert1<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>,_mp::Convert1QC>
              ::operator()(&local_30,con,(int)lVar7);
      if (bVar2) {
        lVar4 = (*(long *)(this + 0xe0) - *(long *)(this + 0xe8) >> 3) * -0x1041041041041041 + lVar7
        ;
        if (lVar4 == 0) {
          lVar4 = *(long *)(this + 0xe0) + lVar6;
        }
        else {
          lVar4 = *(long *)(*(long *)(this + 0xf8) + lVar4 * 8);
        }
        if (*(char *)(lVar4 + 0x1f0) == '\0') {
          *(undefined1 *)(lVar4 + 0x1f0) = 1;
          *(int *)(this + 0x124) = *(int *)(this + 0x124) + 1;
        }
      }
    }
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0x1f8;
  }
  return;
}

Assistant:

void ForEachActive(Fn fn) {
		for (int i=0; i<(int)cons_.size(); ++i)
      if (!cons_[i].IsRedundant())
        if (fn(cons_[i].GetCon(), i))
          MarkAsBridged(cons_[i], i);
	}